

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void set_planes_to_neutral_grey(SequenceHeader *seq_params,YV12_BUFFER_CONFIG *buf,int only_chroma)

{
  void *__src;
  aom_bit_depth_t aVar1;
  size_t i;
  long lVar2;
  int row_idx;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  if (seq_params->use_highbitdepth == '\0') {
    for (lVar4 = (long)only_chroma; lVar4 < 3; lVar4 = lVar4 + 1) {
      uVar5 = (ulong)(0 < lVar4);
      for (iVar3 = 0; iVar3 < *(int *)((long)buf->store_buf_adr + uVar5 * 4 + -0x30);
          iVar3 = iVar3 + 1) {
        memset(buf->store_buf_adr[lVar4 + -4] +
               (long)iVar3 * (long)*(int *)((long)buf->store_buf_adr + uVar5 * 4 + -0x28),0x80,
               (long)*(int *)((long)buf->store_buf_adr + uVar5 * 4 + -0x38));
      }
    }
  }
  else {
    aVar1 = seq_params->bit_depth;
    for (lVar4 = (long)only_chroma; lVar4 < 3; lVar4 = lVar4 + 1) {
      uVar5 = (ulong)(0 < lVar4);
      if (0 < *(int *)((long)buf->store_buf_adr + uVar5 * 4 + -0x30)) {
        __src = (void *)((long)buf->store_buf_adr[lVar4 + -4] * 2);
        iVar3 = *(int *)((long)buf->store_buf_adr + uVar5 * 4 + -0x38);
        for (lVar2 = 0; iVar3 != lVar2; lVar2 = lVar2 + 1) {
          *(short *)((long)__src + lVar2 * 2) = (short)(1 << ((char)aVar1 - 1 & 0x1f));
        }
        for (iVar3 = 1; iVar3 < *(int *)((long)buf->store_buf_adr + uVar5 * 4 + -0x30);
            iVar3 = iVar3 + 1) {
          memcpy((void *)((long)__src +
                         (long)iVar3 * (long)*(int *)((long)buf->store_buf_adr + uVar5 * 4 + -0x28)
                         * 2),__src,(long)*(int *)((long)buf->store_buf_adr + uVar5 * 4 + -0x38) * 2
                );
        }
      }
    }
  }
  return;
}

Assistant:

static inline void set_planes_to_neutral_grey(
    const SequenceHeader *const seq_params, const YV12_BUFFER_CONFIG *const buf,
    int only_chroma) {
  if (seq_params->use_highbitdepth) {
    const int val = 1 << (seq_params->bit_depth - 1);
    for (int plane = only_chroma; plane < MAX_MB_PLANE; plane++) {
      const int is_uv = plane > 0;
      uint16_t *const base = CONVERT_TO_SHORTPTR(buf->buffers[plane]);
      // Set the first row to neutral grey. Then copy the first row to all
      // subsequent rows.
      if (buf->crop_heights[is_uv] > 0) {
        aom_memset16(base, val, buf->crop_widths[is_uv]);
        for (int row_idx = 1; row_idx < buf->crop_heights[is_uv]; row_idx++) {
          memcpy(&base[row_idx * buf->strides[is_uv]], base,
                 sizeof(*base) * buf->crop_widths[is_uv]);
        }
      }
    }
  } else {
    for (int plane = only_chroma; plane < MAX_MB_PLANE; plane++) {
      const int is_uv = plane > 0;
      for (int row_idx = 0; row_idx < buf->crop_heights[is_uv]; row_idx++) {
        memset(&buf->buffers[plane][row_idx * buf->strides[is_uv]], 1 << 7,
               buf->crop_widths[is_uv]);
      }
    }
  }
}